

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression
cnn::expr::log_softmax(Expression *x,vector<unsigned_int,_std::allocator<unsigned_int>_> *d)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_24;
  uint *local_20;
  pointer local_18;
  
  arguments = (ComputationGraph *)
              (d->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_24 = *(uint *)&(d->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
  local_20 = &local_24;
  local_18 = (pointer)0x1;
  ComputationGraph::
  add_function<cnn::RestrictedLogSoftmax,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
            ((ComputationGraph *)&x->i,(initializer_list<cnn::VariableIndex> *)arguments,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_20);
  x->pg = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)x;
  return EVar1;
}

Assistant:

Expression log_softmax(const Expression& x, const vector<unsigned>& d) { return Expression(x.pg, x.pg->add_function<RestrictedLogSoftmax>({x.i}, d)); }